

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

pair<double,_double> __thiscall
HPresolve::getBoundsImpliedFree(HPresolve *this,double lowInit,double uppInit,int col,int i,int k)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  int in_EDX;
  int in_ESI;
  pair<double,_double> pVar6;
  int kk_1;
  int kk;
  double u;
  double l;
  int j;
  double upp;
  double low;
  double *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  int local_68;
  int local_64;
  double local_60;
  double local_58;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                      (size_type)in_stack_ffffffffffffff48);
  for (local_64 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                          (size_type)in_stack_ffffffffffffff48), local_64 < *pvVar2;
      local_64 = local_64 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                        (size_type)in_stack_ffffffffffffff48);
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                        (size_type)in_stack_ffffffffffffff48);
    if ((*pvVar2 != 0) && (iVar1 != in_ESI)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                          (size_type)in_stack_ffffffffffffff48);
      if (in_EDX == *pvVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        local_58 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pdVar5 = std::max<double>(pvVar3,pvVar4);
        local_58 = *pdVar5;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                          (size_type)in_stack_ffffffffffffff48);
      if (in_EDX == *pvVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        local_60 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pdVar5 = std::min<double>(pvVar3,pvVar4);
        local_60 = *pdVar5;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      if (((*pvVar3 <= 0.0 && *pvVar3 != 0.0) &&
          (pvVar3 = std::vector<double,_std::allocator<double>_>::at
                              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48),
          0.0 < *pvVar3)) ||
         ((pvVar3 = std::vector<double,_std::allocator<double>_>::at
                              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48),
          0.0 < *pvVar3 &&
          (pvVar3 = std::vector<double,_std::allocator<double>_>::at
                              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48),
          *pvVar3 <= 0.0 && *pvVar3 != 0.0)))) {
        if ((local_58 == -1e+200) && (!NAN(local_58))) break;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      }
      else {
        if ((local_60 == 1e+200) && (!NAN(local_60))) break;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      }
    }
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                      (size_type)in_stack_ffffffffffffff48);
  for (local_68 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                          (size_type)in_stack_ffffffffffffff48), local_68 < *pvVar2;
      local_68 = local_68 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                        (size_type)in_stack_ffffffffffffff48);
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                        (size_type)in_stack_ffffffffffffff48);
    if ((*pvVar2 != 0) && (iVar1 != in_ESI)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                          (size_type)in_stack_ffffffffffffff48);
      if (in_EDX == *pvVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        local_58 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pdVar5 = std::max<double>(pvVar3,pvVar4);
        local_58 = *pdVar5;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                          (size_type)in_stack_ffffffffffffff48);
      if (in_EDX == *pvVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        local_60 = *pvVar3;
      }
      else {
        in_stack_ffffffffffffff50 =
             (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pdVar5 = std::min<double>((double *)in_stack_ffffffffffffff50,pvVar3);
        local_60 = *pdVar5;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      if (((*pvVar3 <= 0.0 && *pvVar3 != 0.0) &&
          (pvVar3 = std::vector<double,_std::allocator<double>_>::at
                              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48),
          0.0 < *pvVar3)) ||
         ((pvVar3 = std::vector<double,_std::allocator<double>_>::at
                              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48),
          0.0 < *pvVar3 &&
          (pvVar3 = std::vector<double,_std::allocator<double>_>::at
                              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48),
          *pvVar3 <= 0.0 && *pvVar3 != 0.0)))) {
        if ((local_60 == 1e+200) && (!NAN(local_60))) break;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      }
      else {
        if ((local_58 == -1e+200) && (!NAN(local_58))) break;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      }
    }
  }
  pVar6 = std::make_pair<double&,double&>
                    ((double *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return pVar6;
}

Assistant:

pair<double, double> HPresolve::getBoundsImpliedFree(double lowInit, double uppInit,
											const int col, const int i, const int k) {
	double low = lowInit;
	double upp = uppInit;

	//use implied bounds with original bounds
	int j;
	double l,u;
	// if at any stage low becomes  or upp becomes inf break loop  
	// can't use bounds for variables generated by the same row. 
	//low
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
		
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (l==-HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*l;
			else 
				if (u==HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*u;
		}
	}
	//upp
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
			// if at any stage low becomes  or upp becomes inf it's not implied free 
			//low:: 
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (u==HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*u;
			else 
				if (l==-HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*l;
		}
	}
	return make_pair(low, upp);
}